

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O2

int ConnectRazorAHRS(RAZORAHRS *pRazorAHRS,char *szCfgFilePath)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  size_t sVar4;
  char line [256];
  char calibbuf [2048];
  
  memset(pRazorAHRS->szCfgFilePath,0,0x100);
  sprintf(pRazorAHRS->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pRazorAHRS->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRazorAHRS->szDevPath,"COM1",5);
    pRazorAHRS->BaudRate = 0xe100;
    pRazorAHRS->timeout = 2000;
    pRazorAHRS->threadperiod = 0x32;
    pRazorAHRS->bSaveRawData = 1;
    pRazorAHRS->bROSMode = 1;
    *(undefined8 *)&pRazorAHRS->bSendCalibration = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_x_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_x_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_y_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_y_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_z_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_z_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_x_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_x_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_y_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_y_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_z_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_z_max + 4) = 0;
    memset(&pRazorAHRS->ccx,0,0xc0);
    pFVar2 = fopen(szCfgFilePath,"r");
    if (pFVar2 == (FILE *)0x0) {
      pcVar3 = "Configuration file not found.";
    }
    else {
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pRazorAHRS->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->bROSMode);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->bSendCalibration);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_x_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_x_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_y_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_y_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_z_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->accel_z_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_x_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_x_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_y_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_y_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_z_min);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->magn_z_max);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pRazorAHRS->calibration_magn_use_extended);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ccx);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ccy);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ccz);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctxX);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctxY);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctxZ);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctyX);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctyY);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctyZ);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctzX);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctzY);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->ctzZ);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->gyro_average_offset_x);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->gyro_average_offset_y);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->gyro_average_offset_z);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->rollorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->rollp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->rollp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->pitchorientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->pitchp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->pitchp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->yaworientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->yawp1);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar3 = fgets3((FILE *)pFVar2,line,0x100);
      if (pcVar3 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pRazorAHRS->yawp2);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(pFVar2);
      if (iVar1 == 0) goto LAB_00103822;
      pcVar3 = "fclose() failed.";
    }
    puts(pcVar3);
  }
LAB_00103822:
  if (pRazorAHRS->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRazorAHRS->threadperiod = 0x32;
  }
  (pRazorAHRS->LastRazorAHRSData).Pitch = 0.0;
  (pRazorAHRS->LastRazorAHRSData).Yaw = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyrz = 0.0;
  (pRazorAHRS->LastRazorAHRSData).Roll = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyrx = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyry = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accy = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accz = 0.0;
  (pRazorAHRS->LastRazorAHRSData).roll = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accx = 0.0;
  (pRazorAHRS->LastRazorAHRSData).yaw = 0.0;
  (pRazorAHRS->LastRazorAHRSData).pitch = 0.0;
  iVar1 = OpenRS232Port(&pRazorAHRS->RS232Port,pRazorAHRS->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a RazorAHRS.");
    return 1;
  }
  iVar1 = SetOptionsRS232Port(&pRazorAHRS->RS232Port,pRazorAHRS->BaudRate,'\0',0,'\b','\x02',
                              pRazorAHRS->timeout);
  if (iVar1 == 0) {
    if (pRazorAHRS->bSendCalibration != 0) {
      memset(calibbuf,0,0x800);
      if (pRazorAHRS->calibration_magn_use_extended == 0) {
        pcVar3 = 
        "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#cgx%.4f#cgy%.4f#cgz%.4f"
        ;
      }
      else {
        pcVar3 = 
        "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#ccx%.4f#ccy%.4f#ccz%.4f#ctxX%.4f#ctxY%.4f#ctxZ%.4f#ctyX%.4f#ctyY%.4f#ctyZ%.4f#ctzX%.4f#ctzY%.4f#ctzZ%.4f#cgx%.4f#cgy%.4f#cgz%.4f"
        ;
      }
      sprintf(calibbuf,pcVar3,SUB84(pRazorAHRS->accel_x_min,0),pRazorAHRS->accel_x_max,
              pRazorAHRS->accel_y_min,pRazorAHRS->accel_y_max,pRazorAHRS->accel_z_min,
              pRazorAHRS->accel_z_max,pRazorAHRS->magn_x_min,SUB84(pRazorAHRS->magn_x_max,0));
      sVar4 = strlen(calibbuf);
      iVar1 = WriteAllRS232Port(&pRazorAHRS->RS232Port,(uint8 *)calibbuf,(int)sVar4);
      if (iVar1 != 0) {
        pcVar3 = "Unable to connect to a RazorAHRS : Failed to send calibration data.";
        goto LAB_001038bd;
      }
      if ((pRazorAHRS->bSaveRawData != 0) &&
         (pFVar2 = (FILE *)pRazorAHRS->pfSaveFile, pFVar2 != (FILE *)0x0)) {
        sVar4 = strlen(calibbuf);
        fwrite(calibbuf,sVar4,1,pFVar2);
        fflush((FILE *)pRazorAHRS->pfSaveFile);
      }
    }
    if (pRazorAHRS->bROSMode == 0) {
LAB_00103bbb:
      puts("RazorAHRS connected.");
      return 0;
    }
    iVar1 = WriteAllRS232Port(&pRazorAHRS->RS232Port,(uint8 *)"#ox",3);
    if (iVar1 == 0) {
      if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
        fwrite("#ox",3,1,(FILE *)pRazorAHRS->pfSaveFile);
        fflush((FILE *)pRazorAHRS->pfSaveFile);
      }
      iVar1 = WriteAllRS232Port(&pRazorAHRS->RS232Port,(uint8 *)"#o1",3);
      if (iVar1 == 0) {
        if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          fwrite("#o1",3,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
        goto LAB_00103bbb;
      }
    }
    pcVar3 = "Unable to connect to a RazorAHRS : Initialization failure.";
  }
  else {
    pcVar3 = "Unable to connect to a RazorAHRS.";
  }
LAB_001038bd:
  puts(pcVar3);
  CloseRS232Port(&pRazorAHRS->RS232Port);
  return 1;
}

Assistant:

inline int ConnectRazorAHRS(RAZORAHRS* pRazorAHRS, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* outputmodebuf = "#ox";
	char* streammodebuf = "#o1";
	char calibbuf[2048];

	memset(pRazorAHRS->szCfgFilePath, 0, sizeof(pRazorAHRS->szCfgFilePath));
	sprintf(pRazorAHRS->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRazorAHRS->szDevPath, 0, sizeof(pRazorAHRS->szDevPath));
		sprintf(pRazorAHRS->szDevPath, "COM1");
		pRazorAHRS->BaudRate = 57600;
		pRazorAHRS->timeout = 2000;
		pRazorAHRS->threadperiod = 50;
		pRazorAHRS->bSaveRawData = 1;
		pRazorAHRS->bROSMode = 1;
		pRazorAHRS->bSendCalibration = 0;
		pRazorAHRS->accel_x_min = 0; pRazorAHRS->accel_x_max = 0;
		pRazorAHRS->accel_y_min = 0; pRazorAHRS->accel_y_max = 0;
		pRazorAHRS->accel_z_min = 0; pRazorAHRS->accel_z_max = 0;
		pRazorAHRS->magn_x_min = 0; pRazorAHRS->magn_x_max = 0;
		pRazorAHRS->magn_y_min = 0; pRazorAHRS->magn_y_max = 0;
		pRazorAHRS->magn_z_min = 0; pRazorAHRS->magn_z_max = 0;
		pRazorAHRS->calibration_magn_use_extended = 0;
		pRazorAHRS->ccx = 0; pRazorAHRS->ccy = 0; pRazorAHRS->ccz = 0;
		pRazorAHRS->ctxX = 0; pRazorAHRS->ctxY = 0; pRazorAHRS->ctxZ = 0;
		pRazorAHRS->ctyX = 0; pRazorAHRS->ctyY = 0; pRazorAHRS->ctyZ = 0;
		pRazorAHRS->ctzX = 0; pRazorAHRS->ctzY = 0; pRazorAHRS->ctzZ = 0;
		pRazorAHRS->gyro_average_offset_x = 0; pRazorAHRS->gyro_average_offset_y = 0; pRazorAHRS->gyro_average_offset_z = 0;
		pRazorAHRS->rollorientation = 0;
		pRazorAHRS->rollp1 = 0;
		pRazorAHRS->rollp2 = 0;
		pRazorAHRS->pitchorientation = 0;
		pRazorAHRS->pitchp1 = 0;
		pRazorAHRS->pitchp2 = 0;
		pRazorAHRS->yaworientation = 0;
		pRazorAHRS->yawp1 = 0;
		pRazorAHRS->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRazorAHRS->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bROSMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSendCalibration) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->calibration_magn_use_extended) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccx) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccy) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccz) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzZ) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_x) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_y) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_z) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRazorAHRS->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRazorAHRS->threadperiod = 50;
	}

	// Used to save raw data, should be handled specifically...
	//pRazorAHRS->pfSaveFile = NULL;

	memset(&pRazorAHRS->LastRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (OpenRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pRazorAHRS->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		CloseRS232Port(&pRazorAHRS->RS232Port);
		return EXIT_FAILURE;
	}

	if (pRazorAHRS->bSendCalibration)
	{
		memset(calibbuf, 0, sizeof(calibbuf));
		if (pRazorAHRS->calibration_magn_use_extended)
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#ccx%.4f#ccy%.4f#ccz%.4f"
				"#ctxX%.4f#ctxY%.4f#ctxZ%.4f"
				"#ctyX%.4f#ctyY%.4f#ctyZ%.4f"
				"#ctzX%.4f#ctzY%.4f#ctzZ%.4f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->ccx, pRazorAHRS->ccy, pRazorAHRS->ccz,
				pRazorAHRS->ctxX, pRazorAHRS->ctxY, pRazorAHRS->ctxZ,
				pRazorAHRS->ctyX, pRazorAHRS->ctyY, pRazorAHRS->ctyZ,
				pRazorAHRS->ctzX, pRazorAHRS->ctzY, pRazorAHRS->ctzZ,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		else
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)calibbuf, (int)strlen(calibbuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Failed to send calibration data.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
		{
			fwrite(calibbuf, strlen(calibbuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	if (pRazorAHRS->bROSMode)
	{
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)outputmodebuf, (int)strlen(outputmodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(outputmodebuf, strlen(outputmodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)streammodebuf, (int)strlen(streammodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(streammodebuf, strlen(streammodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	printf("RazorAHRS connected.\n");

	return EXIT_SUCCESS;
}